

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSExporter.cpp
# Opt level: O0

void __thiscall Assimp::anon_unknown_0::ChunkWriter::~ChunkWriter(ChunkWriter *this)

{
  size_t new_cursor;
  uint32_t local_20;
  size_t chunk_size;
  size_t head_pos;
  ChunkWriter *this_local;
  
  new_cursor = StreamWriter<false,_false>::GetCurrentPos(this->writer);
  local_20 = (int)new_cursor - (int)this->chunk_start_pos;
  StreamWriter<false,_false>::SetCurrentPos(this->writer,this->chunk_start_pos + 2);
  StreamWriter<false,_false>::PutU4(this->writer,local_20);
  StreamWriter<false,_false>::SetCurrentPos(this->writer,new_cursor);
  return;
}

Assistant:

~ChunkWriter() {
            std::size_t head_pos = writer.GetCurrentPos();

            ai_assert(head_pos > chunk_start_pos);
            const std::size_t chunk_size = head_pos - chunk_start_pos;

            writer.SetCurrentPos(chunk_start_pos + SIZE_OFFSET);
            writer.PutU4(static_cast<uint32_t>(chunk_size));
            writer.SetCurrentPos(head_pos);
        }